

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::PortConnection::makeConnections
          (PortConnection *this,InstanceSymbol *instance,
          span<const_slang::ast::Symbol_*const,_18446744073709551615UL> ports,
          SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *portConnections,
          SmallVector<const_slang::ast::PortConnection_*,_5UL> *results)

{
  char_pointer puVar1;
  group_type_pointer pgVar2;
  SymbolKind SVar3;
  ConstantRange CVar4;
  PortSymbol *args;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  bool bVar8;
  ConstantRange *pCVar9;
  undefined8 this_00;
  int iVar10;
  Scope *pSVar11;
  ConstantRange *pCVar12;
  uint64_t uVar13;
  PortConnection *pPVar14;
  SourceLocation SVar15;
  Diagnostic *pDVar16;
  char_pointer puVar17;
  uint uVar18;
  pointer pCVar19;
  value_type_pointer ppVar20;
  PropertyExprSyntax *pPVar21;
  SourceLocation SVar22;
  SourceLocation unaff_RBX;
  InstanceArraySymbol *sym;
  SourceLocation SVar23;
  char_pointer puVar24;
  group_type_pointer pgVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  iterator __begin2;
  table_element_pointer ppVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  uchar uVar41;
  uchar uVar42;
  uchar uVar43;
  uchar uVar44;
  uchar uVar45;
  uchar uVar46;
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  uchar uVar50;
  uchar uVar51;
  uchar uVar52;
  uchar uVar53;
  uchar uVar54;
  uchar uVar55;
  uchar uVar56;
  LookupLocation lookupLocation;
  LookupLocation lookupLocation_00;
  LookupLocation lookupLocation_01;
  LookupLocation lookupLocation_02;
  LookupLocation lookupLocation_03;
  LookupLocation lookupLocation_04;
  LookupLocation LVar57;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar58;
  SourceRange range;
  SourceRange range_00;
  SourceRange SVar59;
  iterator iVar60;
  string_view arg;
  SourceRange range_01;
  PortConnection *conn_2;
  PortConnection *conn;
  PortConnectionBuilder builder;
  bool local_2f9;
  SourceLocation local_2f8;
  ulong local_2f0;
  ulong local_2e8;
  value_type_pointer local_2e0;
  value_type_pointer local_2d8;
  group_type_pointer local_2d0;
  ulong local_2c8;
  SourceLocation local_2c0;
  Token local_2b8;
  undefined8 local_2a8;
  uchar uStack_2a0;
  uchar uStack_29f;
  uchar uStack_29e;
  uchar uStack_29d;
  uchar uStack_29c;
  uchar uStack_29b;
  uchar uStack_29a;
  uchar uStack_299;
  undefined8 local_298;
  uchar uStack_290;
  uchar uStack_28f;
  uchar uStack_28e;
  uchar uStack_28d;
  uchar uStack_28c;
  uchar uStack_28b;
  uchar uStack_28a;
  uchar uStack_289;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *local_288;
  PortConnection *local_280;
  long local_278;
  SymbolKind *local_270;
  undefined1 local_268 [376];
  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
  local_f0;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> local_b8;
  SourceLocation local_a8;
  SourceLocation local_a0;
  bool local_98;
  bool local_97;
  SmallVectorBase<slang::ConstantRange> local_88;
  ulong local_50;
  undefined2 local_48;
  
  local_268._0_8_ = (this->field_4).exprSyntax;
  local_268._16_8_ = *(undefined8 *)&((Scope *)local_268._0_8_)->compilation;
  local_288 = portConnections;
  local_268._8_8_ = this;
  LVar57 = LookupLocation::after((Symbol *)this);
  local_268._24_8_ = LVar57.scope;
  local_268._32_4_ = LVar57.index;
  lookupLocation._12_4_ = 0;
  lookupLocation.scope = (Scope *)SUB128(LVar57._0_12_,0);
  lookupLocation.index = SUB124(LVar57._0_12_,8);
  ConnMap::ConnMap((ConnMap *)(local_268 + 0x30),
                   (SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *)
                   ports._M_extent._M_extent_value._M_extent_value,(Scope *)local_268._0_8_,
                   lookupLocation);
  local_88.data_ = (pointer)local_88.firstElement;
  local_88.len = 0;
  local_88.cap = 4;
  local_50 = 0;
  local_48._0_1_ = false;
  local_48._1_1_ = false;
  if ((Scope *)local_268._0_8_ != (Scope *)0x0) {
    pSVar11 = (Scope *)local_268._0_8_;
    do {
      unaff_RBX = (SourceLocation)pSVar11->thisSym;
      if (*(int *)unaff_RBX != 0x31) break;
      SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange_const&>
                (&local_88,(ConstantRange *)((long)unaff_RBX + 0x88));
      pSVar11 = *(Scope **)((long)unaff_RBX + 0x20);
    } while (pSVar11 != (Scope *)0x0);
  }
  pCVar19 = local_88.data_ + (local_88.len - 1);
  pCVar9 = local_88.data_;
  if (local_88.data_ < pCVar19 && local_88.len != 0) {
    do {
      pCVar12 = pCVar9 + 1;
      CVar4 = *pCVar9;
      *pCVar9 = *pCVar19;
      *pCVar19 = CVar4;
      pCVar19 = pCVar19 + -1;
      pCVar9 = pCVar12;
    } while (pCVar12 < pCVar19);
  }
  if (ports._M_ptr != (pointer)0x0) {
    local_270 = &(instance->super_InstanceSymbolBase).super_Symbol.kind + (long)ports._M_ptr * 2;
    do {
      args = *(PortSymbol **)&(instance->super_InstanceSymbolBase).super_Symbol;
      SVar3 = (args->super_Symbol).kind;
      if (SVar3 == MultiPort) {
        local_2b8.info = (Info *)local_268;
        local_2b8._0_8_ = args;
        if (local_98 == true) {
          uVar26 = local_50 + 1;
          if (local_50 < (ulong)local_268._56_8_) {
            unaff_RBX = *(SourceLocation *)(local_268._48_8_ + local_50 * 8);
            lookupLocation_01.index = local_268._32_4_;
            lookupLocation_01.scope = (Scope *)local_268._24_8_;
            lookupLocation_01._12_4_ = 0;
            local_50 = local_50 + 1;
            sVar58 = AttributeSymbol::fromSyntax
                               (*(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                  *)((long)unaff_RBX + 0x40),(Scope *)local_268._0_8_,
                                lookupLocation_01);
            if (*(int *)unaff_RBX == 0x155) {
              pPVar21 = *(PropertyExprSyntax **)((long)unaff_RBX + 0x50);
LAB_0030a37a:
              pPVar14 = anon_unknown_0::PortConnectionBuilder::
                        createConnection<slang::ast::MultiPortSymbol>
                                  ((PortConnectionBuilder *)local_268,(MultiPortSymbol *)args,
                                   pPVar21,sVar58);
            }
            else {
              local_2f9 = false;
              pPVar14 = BumpAllocator::
                        emplace<slang::ast::PortConnection,slang::ast::MultiPortSymbol_const&,bool>
                                  ((BumpAllocator *)local_268._16_8_,(MultiPortSymbol *)args,
                                   &local_2f9);
              if (sVar58._M_extent._M_extent_value._M_extent_value != 0) {
                Compilation::setAttributes((Compilation *)local_268._16_8_,pPVar14,sVar58);
              }
            }
          }
          else {
LAB_0030a678:
            local_50 = uVar26;
            pPVar14 = anon_unknown_0::PortConnectionBuilder::
                      getConnection<slang::ast::MultiPortSymbol>::anon_class_16_2_3fb12ad6::
                      operator()((anon_class_16_2_3fb12ad6 *)&local_2b8);
          }
        }
        else {
          uVar26 = local_50;
          if ((args->super_Symbol).name._M_len == 0) goto LAB_0030a678;
          uVar13 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &local_f0,&(args->super_Symbol).name);
          uVar26 = uVar13 >> ((byte)local_f0.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                                    .arrays.groups_size_index & 0x3f);
          lVar29 = (uVar13 & 0xff) * 4;
          uVar41 = (&UNK_0051605c)[lVar29];
          uVar42 = (&UNK_0051605d)[lVar29];
          uVar43 = (&UNK_0051605e)[lVar29];
          uVar44 = (&UNK_0051605f)[lVar29];
          local_2f8 = (SourceLocation)(args->super_Symbol).name._M_len;
          local_298 = (args->super_Symbol).name._M_str;
          SVar15._0_4_ = (uint)uVar13 & 7;
          SVar15._4_4_ = 0;
          uVar30 = 0;
          ppVar20 = local_f0.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                    .arrays.elements_;
          pgVar25 = local_f0.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                    .arrays.groups_;
          local_2e0 = (value_type_pointer)
                      local_f0.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                      .arrays.groups_size_mask;
          uVar45 = uVar41;
          uVar46 = uVar42;
          uVar47 = uVar43;
          uVar48 = uVar44;
          uVar49 = uVar41;
          uVar50 = uVar42;
          uVar51 = uVar43;
          uVar52 = uVar44;
          uVar53 = uVar41;
          uVar54 = uVar42;
          uVar55 = uVar43;
          uVar56 = uVar44;
          do {
            pgVar2 = pgVar25 + uVar26;
            auVar38[0] = -(pgVar2->m[0].n == uVar41);
            auVar38[1] = -(pgVar2->m[1].n == uVar42);
            auVar38[2] = -(pgVar2->m[2].n == uVar43);
            auVar38[3] = -(pgVar2->m[3].n == uVar44);
            auVar38[4] = -(pgVar2->m[4].n == uVar45);
            auVar38[5] = -(pgVar2->m[5].n == uVar46);
            auVar38[6] = -(pgVar2->m[6].n == uVar47);
            auVar38[7] = -(pgVar2->m[7].n == uVar48);
            auVar38[8] = -(pgVar2->m[8].n == uVar49);
            auVar38[9] = -(pgVar2->m[9].n == uVar50);
            auVar38[10] = -(pgVar2->m[10].n == uVar51);
            auVar38[0xb] = -(pgVar2->m[0xb].n == uVar52);
            auVar38[0xc] = -(pgVar2->m[0xc].n == uVar53);
            auVar38[0xd] = -(pgVar2->m[0xd].n == uVar54);
            auVar38[0xe] = -(pgVar2->m[0xe].n == uVar55);
            auVar38[0xf] = -(pgVar2->m[0xf].n == uVar56);
            uVar18 = (uint)(ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe);
            local_2d8 = ppVar20;
            uVar28 = uVar26;
            uVar27 = uVar30;
            uVar31 = uVar26 * 0x10;
            if (uVar18 != 0) {
              local_2a8._0_2_ = CONCAT11(uVar42,uVar41);
              local_2a8._0_3_ = CONCAT12(uVar43,(undefined2)local_2a8);
              local_2a8._0_4_ = CONCAT13(uVar44,(undefined3)local_2a8);
              local_2a8._0_5_ = CONCAT14(uVar45,(undefined4)local_2a8);
              local_2a8._0_6_ = CONCAT15(uVar46,(undefined5)local_2a8);
              local_2a8._0_7_ = CONCAT16(uVar47,(undefined6)local_2a8);
              local_2a8 = (value_type_pointer)CONCAT17(uVar48,(undefined7)local_2a8);
              SVar22 = local_2f8;
              local_2f0 = uVar26 * 0x10;
              local_2e8 = uVar30;
              local_2d0 = pgVar25;
              local_2c8 = uVar26;
              local_2c0 = SVar15;
              uStack_2a0 = uVar49;
              uStack_29f = uVar50;
              uStack_29e = uVar51;
              uStack_29d = uVar52;
              uStack_29c = uVar53;
              uStack_29b = uVar54;
              uStack_29a = uVar55;
              uStack_299 = uVar56;
              do {
                iVar10 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
                  }
                }
                unaff_RBX = (SourceLocation)
                            ((long)&ppVar20[uVar26 * 0xf].first._M_len + (ulong)(uint)(iVar10 << 5))
                ;
                SVar15 = *(SourceLocation *)
                          ((long)&ppVar20[uVar26 * 0xf].first._M_len + (ulong)(uint)(iVar10 << 5));
                bVar35 = SVar22 == SVar15;
                if ((SVar22 != (SourceLocation)0x0) && (SVar22 == SVar15)) {
                  iVar10 = bcmp(local_298,*(void **)((long)unaff_RBX + 8),(size_t)SVar22);
                  bVar35 = iVar10 == 0;
                  SVar22 = local_2f8;
                  uVar41 = (uchar)local_2a8;
                  uVar42 = local_2a8._1_1_;
                  uVar43 = local_2a8._2_1_;
                  uVar44 = local_2a8._3_1_;
                  uVar45 = local_2a8._4_1_;
                  uVar46 = local_2a8._5_1_;
                  uVar47 = local_2a8._6_1_;
                  uVar48 = local_2a8._7_1_;
                  uVar49 = uStack_2a0;
                  uVar50 = uStack_29f;
                  uVar51 = uStack_29e;
                  uVar52 = uStack_29d;
                  uVar53 = uStack_29c;
                  uVar54 = uStack_29b;
                  uVar55 = uStack_29a;
                  uVar56 = uStack_299;
                }
                if (bVar35) goto LAB_0030aa98;
                uVar18 = uVar18 - 1 & uVar18;
                SVar15 = local_2c0;
                uVar28 = local_2c8;
                pgVar25 = local_2d0;
                uVar27 = local_2e8;
                uVar31 = local_2f0;
              } while (uVar18 != 0);
            }
            if ((pgVar25->m[uVar31 + 0xf].n &
                (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[(long)SVar15]) == 0) break;
            uVar30 = uVar27 + 1;
            uVar26 = uVar28 + uVar27 + 1 & (ulong)local_2e0;
            ppVar20 = local_2d8;
          } while (uVar30 <= local_2e0);
          unaff_RBX = (SourceLocation)0x0;
LAB_0030aa98:
          if (unaff_RBX == (SourceLocation)0x0) {
            uVar26 = local_50;
            if (local_97 != true) goto LAB_0030a678;
            range_00.endLoc = local_a0;
            range_00.startLoc = local_a8;
            sVar58 = local_b8;
          }
          else {
            lVar29 = *(long *)((long)unaff_RBX + 0x10);
            *(undefined1 *)((long)unaff_RBX + 0x18) = 1;
            LVar57.index = local_268._32_4_;
            LVar57.scope = (Scope *)local_268._24_8_;
            LVar57._12_4_ = 0;
            local_2f8 = unaff_RBX;
            sVar58 = AttributeSymbol::fromSyntax
                               (*(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                  *)(lVar29 + 0x40),(Scope *)local_268._0_8_,LVar57);
            if (*(long *)(lVar29 + 0x78) != 0) {
              pPVar21 = *(PropertyExprSyntax **)(lVar29 + 0x80);
              if (pPVar21 != (PropertyExprSyntax *)0x0) goto LAB_0030a37a;
              pPVar14 = BumpAllocator::
                        emplace<slang::ast::PortConnection,slang::ast::MultiPortSymbol_const&>
                                  ((BumpAllocator *)local_268._16_8_,(MultiPortSymbol *)args);
              goto LAB_0030a685;
            }
            range_00 = parsing::Token::range((Token *)(lVar29 + 0x60));
            unaff_RBX = local_2f8;
          }
          pPVar14 = anon_unknown_0::PortConnectionBuilder::
                    implicitNamedPort<slang::ast::MultiPortSymbol>
                              ((PortConnectionBuilder *)local_268,(MultiPortSymbol *)args,sVar58,
                               range_00,unaff_RBX == (SourceLocation)0x0);
        }
LAB_0030a685:
        local_280 = pPVar14;
        SmallVectorBase<slang::ast::PortConnection_const*>::
        emplace_back<slang::ast::PortConnection_const*const&>
                  ((SmallVectorBase<slang::ast::PortConnection_const*> *)local_288,&local_280);
      }
      else if (SVar3 == Port) {
        local_2b8.info = (Info *)local_268;
        local_2b8._0_8_ = args;
        bVar35 = args->initializerSyntax == (ExpressionSyntax *)0x0;
        bVar8 = args->initializer == (Expression *)0x0;
        bVar33 = args->direction != In;
        if (local_98 == true) {
          uVar26 = local_50 + 1;
          if (local_50 < (ulong)local_268._56_8_) {
            unaff_RBX = *(SourceLocation *)(local_268._48_8_ + local_50 * 8);
            lookupLocation_00.index = local_268._32_4_;
            lookupLocation_00.scope = (Scope *)local_268._24_8_;
            lookupLocation_00._12_4_ = 0;
            local_50 = uVar26;
            sVar58 = AttributeSymbol::fromSyntax
                               (*(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                  *)((long)unaff_RBX + 0x40),(Scope *)local_268._0_8_,
                                lookupLocation_00);
            if (*(int *)unaff_RBX == 0x155) {
              pPVar21 = *(PropertyExprSyntax **)((long)unaff_RBX + 0x50);
LAB_0030a2d6:
              local_280 = anon_unknown_0::PortConnectionBuilder::
                          createConnection<slang::ast::PortSymbol>
                                    ((PortConnectionBuilder *)local_268,args,pPVar21,sVar58);
            }
            else {
              local_280 = anon_unknown_0::PortConnectionBuilder::defaultConnection
                                    ((PortConnectionBuilder *)local_268,args,sVar58);
            }
          }
          else {
            local_50 = uVar26;
            if (bVar33 || bVar35 && bVar8) goto LAB_0030ae35;
            local_2f9 = true;
            local_280 = BumpAllocator::
                        emplace<slang::ast::PortConnection,slang::ast::PortSymbol_const&,bool>
                                  ((BumpAllocator *)local_268._16_8_,args,&local_2f9);
          }
        }
        else if ((args->super_Symbol).name._M_len == 0) {
LAB_0030ae35:
          local_280 = anon_unknown_0::PortConnectionBuilder::getConnection<slang::ast::PortSymbol>::
                      anon_class_16_2_3fb12ad6::operator()((anon_class_16_2_3fb12ad6 *)&local_2b8);
        }
        else {
          uVar13 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &local_f0,&(args->super_Symbol).name);
          pgVar25 = (group_type_pointer)
                    (uVar13 >>
                    ((byte)local_f0.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                           .arrays.groups_size_index & 0x3f));
          lVar29 = (uVar13 & 0xff) * 4;
          uVar41 = (&UNK_0051605c)[lVar29];
          uVar42 = (&UNK_0051605d)[lVar29];
          uVar43 = (&UNK_0051605e)[lVar29];
          uVar44 = (&UNK_0051605f)[lVar29];
          sVar5 = (args->super_Symbol).name._M_len;
          local_298 = (args->super_Symbol).name._M_str;
          uVar30 = (ulong)((uint)uVar13 & 7);
          uVar28 = 0;
          local_2e0 = local_f0.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                      .arrays.elements_;
          local_2d8 = (value_type_pointer)
                      local_f0.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                      .arrays.groups_;
          uVar26 = local_f0.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                   .arrays.groups_size_mask;
          uVar45 = uVar41;
          uVar46 = uVar42;
          uVar47 = uVar43;
          uVar48 = uVar44;
          uVar49 = uVar41;
          uVar50 = uVar42;
          uVar51 = uVar43;
          uVar52 = uVar44;
          uVar53 = uVar41;
          uVar54 = uVar42;
          uVar55 = uVar43;
          uVar56 = uVar44;
          do {
            pgVar2 = (group_type_pointer)((long)local_2d8 + pgVar25 * 0x10);
            auVar36[0] = -(pgVar2->m[0].n == uVar41);
            auVar36[1] = -(pgVar2->m[1].n == uVar42);
            auVar36[2] = -(pgVar2->m[2].n == uVar43);
            auVar36[3] = -(pgVar2->m[3].n == uVar44);
            auVar36[4] = -(pgVar2->m[4].n == uVar45);
            auVar36[5] = -(pgVar2->m[5].n == uVar46);
            auVar36[6] = -(pgVar2->m[6].n == uVar47);
            auVar36[7] = -(pgVar2->m[7].n == uVar48);
            auVar36[8] = -(pgVar2->m[8].n == uVar49);
            auVar36[9] = -(pgVar2->m[9].n == uVar50);
            auVar36[10] = -(pgVar2->m[10].n == uVar51);
            auVar36[0xb] = -(pgVar2->m[0xb].n == uVar52);
            auVar36[0xc] = -(pgVar2->m[0xc].n == uVar53);
            auVar36[0xd] = -(pgVar2->m[0xd].n == uVar54);
            auVar36[0xe] = -(pgVar2->m[0xe].n == uVar55);
            auVar36[0xf] = -(pgVar2->m[0xf].n == uVar56);
            uVar18 = (uint)(ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe);
            uVar27 = uVar28;
            lVar29 = (long)pgVar25 * 0x10;
            if (uVar18 != 0) {
              SVar15 = (SourceLocation)(local_2e0 + (long)pgVar25 * 0xf);
              local_2a8._0_2_ = CONCAT11(uVar42,uVar41);
              local_2a8._0_3_ = CONCAT12(uVar43,(undefined2)local_2a8);
              local_2a8._0_4_ = CONCAT13(uVar44,(undefined3)local_2a8);
              local_2a8._0_5_ = CONCAT14(uVar45,(undefined4)local_2a8);
              local_2a8._0_6_ = CONCAT15(uVar46,(undefined5)local_2a8);
              local_2a8._0_7_ = CONCAT16(uVar47,(undefined6)local_2a8);
              local_2a8 = (value_type_pointer)CONCAT17(uVar48,(undefined7)local_2a8);
              local_2f8 = unaff_RBX;
              local_2f0 = uVar28;
              local_2e8 = uVar26;
              local_2d0 = pgVar25;
              local_2c8 = uVar30;
              local_2c0 = SVar15;
              uStack_2a0 = uVar49;
              uStack_29f = uVar50;
              uStack_29e = uVar51;
              uStack_29d = uVar52;
              uStack_29c = uVar53;
              uStack_29b = uVar54;
              uStack_29a = uVar55;
              uStack_299 = uVar56;
              local_278 = (long)pgVar25 * 0x10;
              do {
                iVar10 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
                  }
                }
                unaff_RBX = (SourceLocation)((long)SVar15 + (ulong)(uint)(iVar10 << 5));
                sVar6 = *(size_t *)((long)SVar15 + (ulong)(uint)(iVar10 << 5));
                bVar34 = sVar5 == sVar6;
                if ((sVar5 != 0) && (sVar5 == sVar6)) {
                  iVar10 = bcmp(local_298,*(void **)((long)unaff_RBX + 8),sVar5);
                  bVar34 = iVar10 == 0;
                  SVar15 = local_2c0;
                  uVar41 = (uchar)local_2a8;
                  uVar42 = local_2a8._1_1_;
                  uVar43 = local_2a8._2_1_;
                  uVar44 = local_2a8._3_1_;
                  uVar45 = local_2a8._4_1_;
                  uVar46 = local_2a8._5_1_;
                  uVar47 = local_2a8._6_1_;
                  uVar48 = local_2a8._7_1_;
                  uVar49 = uStack_2a0;
                  uVar50 = uStack_29f;
                  uVar51 = uStack_29e;
                  uVar52 = uStack_29d;
                  uVar53 = uStack_29c;
                  uVar54 = uStack_29b;
                  uVar55 = uStack_29a;
                  uVar56 = uStack_299;
                }
                if (bVar34) goto LAB_0030a601;
                uVar18 = uVar18 - 1 & uVar18;
                unaff_RBX = local_2f8;
                pgVar25 = local_2d0;
                uVar26 = local_2e8;
                uVar27 = local_2f0;
                lVar29 = local_278;
                uVar30 = local_2c8;
              } while (uVar18 != 0);
            }
            if ((((group_type_pointer)local_2d8)->m[lVar29 + 0xf].n &
                (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[uVar30]) == 0) break;
            uVar28 = uVar27 + 1;
            pgVar25 = (group_type_pointer)((ulong)(pgVar25->m + uVar27 + 1) & uVar26);
          } while (uVar28 <= uVar26);
          unaff_RBX = (SourceLocation)0x0;
LAB_0030a601:
          if (unaff_RBX == (SourceLocation)0x0) {
            if (local_97 == true) {
              range.endLoc = local_a0;
              range.startLoc = local_a8;
              sVar58 = local_b8;
              goto LAB_0030adb1;
            }
            if (bVar33 || bVar35 && bVar8) goto LAB_0030ae35;
            local_2f9 = true;
            local_280 = BumpAllocator::
                        emplace<slang::ast::PortConnection,slang::ast::PortSymbol_const&,bool>
                                  ((BumpAllocator *)local_268._16_8_,args,&local_2f9);
          }
          else {
            lVar29 = *(long *)((long)unaff_RBX + 0x10);
            *(undefined1 *)((long)unaff_RBX + 0x18) = 1;
            lookupLocation_03.index = local_268._32_4_;
            lookupLocation_03.scope = (Scope *)local_268._24_8_;
            lookupLocation_03._12_4_ = 0;
            sVar58 = AttributeSymbol::fromSyntax
                               (*(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                  *)(lVar29 + 0x40),(Scope *)local_268._0_8_,lookupLocation_03);
            if (*(long *)(lVar29 + 0x78) == 0) {
              range = parsing::Token::range((Token *)(lVar29 + 0x60));
LAB_0030adb1:
              local_280 = anon_unknown_0::PortConnectionBuilder::
                          implicitNamedPort<slang::ast::PortSymbol>
                                    ((PortConnectionBuilder *)local_268,args,sVar58,range,
                                     unaff_RBX == (SourceLocation)0x0);
            }
            else {
              pPVar21 = *(PropertyExprSyntax **)(lVar29 + 0x80);
              if (pPVar21 != (PropertyExprSyntax *)0x0) goto LAB_0030a2d6;
              local_280 = BumpAllocator::
                          emplace<slang::ast::PortConnection,slang::ast::PortSymbol_const&>
                                    ((BumpAllocator *)local_268._16_8_,args);
            }
          }
        }
        SmallVectorBase<slang::ast::PortConnection_const*>::
        emplace_back<slang::ast::PortConnection_const*const&>
                  ((SmallVectorBase<slang::ast::PortConnection_const*> *)local_288,&local_280);
      }
      else {
        if (((args->internalSymbol == (Symbol *)0x0) && (((ulong)args->type & 1) == 0)) ||
           ((args->super_Symbol).name._M_len == 0)) {
          if (local_98 == true) {
            local_50 = local_50 + 1;
          }
          else {
            uVar13 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )&local_f0,&(args->super_Symbol).name);
            uVar26 = uVar13 >> ((byte)local_f0.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                                      .arrays.groups_size_index & 0x3f);
            lVar29 = (uVar13 & 0xff) * 4;
            uVar41 = (&UNK_0051605c)[lVar29];
            uVar42 = (&UNK_0051605d)[lVar29];
            uVar43 = (&UNK_0051605e)[lVar29];
            uVar44 = (&UNK_0051605f)[lVar29];
            sVar5 = (args->super_Symbol).name._M_len;
            local_2f8 = (SourceLocation)(args->super_Symbol).name._M_str;
            unaff_RBX._0_4_ = (uint)uVar13 & 7;
            unaff_RBX._4_4_ = 0;
            uVar30 = 0;
            local_2d8 = local_f0.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                        .arrays.elements_;
            pgVar25 = local_f0.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                      .arrays.groups_;
            local_2e0 = (value_type_pointer)
                        local_f0.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                        .arrays.groups_size_mask;
            uVar45 = uVar41;
            uVar46 = uVar42;
            uVar47 = uVar43;
            uVar48 = uVar44;
            uVar49 = uVar41;
            uVar50 = uVar42;
            uVar51 = uVar43;
            uVar52 = uVar44;
            uVar53 = uVar41;
            uVar54 = uVar42;
            uVar55 = uVar43;
            uVar56 = uVar44;
            do {
              pgVar2 = pgVar25 + uVar26;
              auVar37[0] = -(pgVar2->m[0].n == uVar41);
              auVar37[1] = -(pgVar2->m[1].n == uVar42);
              auVar37[2] = -(pgVar2->m[2].n == uVar43);
              auVar37[3] = -(pgVar2->m[3].n == uVar44);
              auVar37[4] = -(pgVar2->m[4].n == uVar45);
              auVar37[5] = -(pgVar2->m[5].n == uVar46);
              auVar37[6] = -(pgVar2->m[6].n == uVar47);
              auVar37[7] = -(pgVar2->m[7].n == uVar48);
              auVar37[8] = -(pgVar2->m[8].n == uVar49);
              auVar37[9] = -(pgVar2->m[9].n == uVar50);
              auVar37[10] = -(pgVar2->m[10].n == uVar51);
              auVar37[0xb] = -(pgVar2->m[0xb].n == uVar52);
              auVar37[0xc] = -(pgVar2->m[0xc].n == uVar53);
              auVar37[0xd] = -(pgVar2->m[0xd].n == uVar54);
              auVar37[0xe] = -(pgVar2->m[0xe].n == uVar55);
              auVar37[0xf] = -(pgVar2->m[0xf].n == uVar56);
              uVar18 = (uint)(ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe);
              uVar28 = uVar30;
              uVar27 = uVar26 * 0x10;
              if (uVar18 != 0) {
                ppVar20 = local_2d8 + uVar26 * 0xf;
                local_298 = (char *)CONCAT17(uVar48,CONCAT16(uVar47,CONCAT15(uVar46,CONCAT14(uVar45,
                                                  CONCAT13(uVar44,CONCAT12(uVar43,CONCAT11(uVar42,
                                                  uVar41)))))));
                local_2f0 = uVar26 * 0x10;
                local_2e8 = uVar30;
                local_2d0 = pgVar25;
                local_2c8 = uVar26;
                local_2c0 = unaff_RBX;
                local_2a8 = ppVar20;
                uStack_290 = uVar49;
                uStack_28f = uVar50;
                uStack_28e = uVar51;
                uStack_28d = uVar52;
                uStack_28c = uVar53;
                uStack_28b = uVar54;
                uStack_28a = uVar55;
                uStack_289 = uVar56;
                do {
                  unaff_RBX._4_4_ = 0;
                  unaff_RBX._0_4_ = uVar18;
                  iVar10 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
                    }
                  }
                  lVar29 = (long)&(ppVar20->first)._M_len + (ulong)(uint)(iVar10 << 5);
                  sVar6 = *(size_t *)((long)&(ppVar20->first)._M_len + (ulong)(uint)(iVar10 << 5));
                  bVar35 = sVar5 == sVar6;
                  if ((sVar5 != 0) && (sVar5 == sVar6)) {
                    iVar10 = bcmp((void *)local_2f8,*(void **)(lVar29 + 8),sVar5);
                    bVar35 = iVar10 == 0;
                    ppVar20 = local_2a8;
                    uVar41 = (uchar)local_298;
                    uVar42 = local_298._1_1_;
                    uVar43 = local_298._2_1_;
                    uVar44 = local_298._3_1_;
                    uVar45 = local_298._4_1_;
                    uVar46 = local_298._5_1_;
                    uVar47 = local_298._6_1_;
                    uVar48 = local_298._7_1_;
                    uVar49 = uStack_290;
                    uVar50 = uStack_28f;
                    uVar51 = uStack_28e;
                    uVar52 = uStack_28d;
                    uVar53 = uStack_28c;
                    uVar54 = uStack_28b;
                    uVar55 = uStack_28a;
                    uVar56 = uStack_289;
                  }
                  if (bVar35) goto LAB_0030a910;
                  uVar18 = uVar18 - 1 & uVar18;
                  unaff_RBX = local_2c0;
                  uVar26 = local_2c8;
                  pgVar25 = local_2d0;
                  uVar28 = local_2e8;
                  uVar27 = local_2f0;
                } while (uVar18 != 0);
              }
              if ((pgVar25->m[uVar27 + 0xf].n &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[(long)unaff_RBX]) == 0) break;
              uVar30 = uVar28 + 1;
              uVar26 = uVar26 + uVar28 + 1 & (ulong)local_2e0;
            } while (uVar30 <= local_2e0);
            lVar29 = 0;
LAB_0030a910:
            if (lVar29 != 0) {
              *(undefined1 *)(lVar29 + 0x18) = 1;
            }
          }
LAB_0030a449:
          pPVar14 = BumpAllocator::
                    emplace<slang::ast::PortConnection,slang::ast::InterfacePortSymbol_const&>
                              ((BumpAllocator *)local_268._16_8_,(InterfacePortSymbol *)args);
        }
        else {
          if (local_98 != true) {
            uVar13 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )&local_f0,&(args->super_Symbol).name);
            uVar26 = uVar13 >> ((byte)local_f0.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                                      .arrays.groups_size_index & 0x3f);
            lVar29 = (uVar13 & 0xff) * 4;
            uVar41 = (&UNK_0051605c)[lVar29];
            uVar42 = (&UNK_0051605d)[lVar29];
            uVar43 = (&UNK_0051605e)[lVar29];
            uVar44 = (&UNK_0051605f)[lVar29];
            local_2f8 = (SourceLocation)(args->super_Symbol).name._M_len;
            local_298 = (args->super_Symbol).name._M_str;
            SVar22._0_4_ = (uint)uVar13 & 7;
            SVar22._4_4_ = 0;
            uVar30 = 0;
            ppVar20 = local_f0.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                      .arrays.elements_;
            pgVar25 = local_f0.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                      .arrays.groups_;
            local_2e0 = (value_type_pointer)
                        local_f0.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                        .arrays.groups_size_mask;
            uVar45 = uVar41;
            uVar46 = uVar42;
            uVar47 = uVar43;
            uVar48 = uVar44;
            uVar49 = uVar41;
            uVar50 = uVar42;
            uVar51 = uVar43;
            uVar52 = uVar44;
            uVar53 = uVar41;
            uVar54 = uVar42;
            uVar55 = uVar43;
            uVar56 = uVar44;
            do {
              pgVar2 = pgVar25 + uVar26;
              auVar39[0] = -(pgVar2->m[0].n == uVar41);
              auVar39[1] = -(pgVar2->m[1].n == uVar42);
              auVar39[2] = -(pgVar2->m[2].n == uVar43);
              auVar39[3] = -(pgVar2->m[3].n == uVar44);
              auVar39[4] = -(pgVar2->m[4].n == uVar45);
              auVar39[5] = -(pgVar2->m[5].n == uVar46);
              auVar39[6] = -(pgVar2->m[6].n == uVar47);
              auVar39[7] = -(pgVar2->m[7].n == uVar48);
              auVar39[8] = -(pgVar2->m[8].n == uVar49);
              auVar39[9] = -(pgVar2->m[9].n == uVar50);
              auVar39[10] = -(pgVar2->m[10].n == uVar51);
              auVar39[0xb] = -(pgVar2->m[0xb].n == uVar52);
              auVar39[0xc] = -(pgVar2->m[0xc].n == uVar53);
              auVar39[0xd] = -(pgVar2->m[0xd].n == uVar54);
              auVar39[0xe] = -(pgVar2->m[0xe].n == uVar55);
              auVar39[0xf] = -(pgVar2->m[0xf].n == uVar56);
              uVar18 = CONCAT22(0,(ushort)(SUB161(auVar39 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe);
              local_2d8 = ppVar20;
              uVar28 = uVar26;
              uVar27 = uVar30;
              uVar31 = uVar26 * 0x10;
              if (uVar18 != 0) {
                unaff_RBX._4_4_ = 0;
                unaff_RBX._0_4_ = uVar18;
                local_2a8._0_2_ = CONCAT11(uVar42,uVar41);
                local_2a8._0_3_ = CONCAT12(uVar43,(undefined2)local_2a8);
                local_2a8._0_4_ = CONCAT13(uVar44,(undefined3)local_2a8);
                local_2a8._0_5_ = CONCAT14(uVar45,(undefined4)local_2a8);
                local_2a8._0_6_ = CONCAT15(uVar46,(undefined5)local_2a8);
                local_2a8._0_7_ = CONCAT16(uVar47,(undefined6)local_2a8);
                local_2a8 = (value_type_pointer)CONCAT17(uVar48,(undefined7)local_2a8);
                SVar15 = local_2f8;
                local_2f0 = uVar26 * 0x10;
                local_2e8 = uVar30;
                local_2d0 = pgVar25;
                local_2c8 = uVar26;
                local_2c0 = SVar22;
                uStack_2a0 = uVar49;
                uStack_29f = uVar50;
                uStack_29e = uVar51;
                uStack_29d = uVar52;
                uStack_29c = uVar53;
                uStack_29b = uVar54;
                uStack_29a = uVar55;
                uStack_299 = uVar56;
                do {
                  iVar10 = 0;
                  uVar18 = unaff_RBX._0_4_;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
                    }
                  }
                  SVar23 = (SourceLocation)
                           ((long)&ppVar20[uVar26 * 0xf].first._M_len + (ulong)(uint)(iVar10 << 5));
                  SVar22 = *(SourceLocation *)
                            ((long)&ppVar20[uVar26 * 0xf].first._M_len + (ulong)(uint)(iVar10 << 5))
                  ;
                  bVar35 = SVar15 == SVar22;
                  if ((SVar15 != (SourceLocation)0x0) && (SVar15 == SVar22)) {
                    iVar10 = bcmp(local_298,*(void **)((long)SVar23 + 8),(size_t)SVar15);
                    bVar35 = iVar10 == 0;
                    SVar15 = local_2f8;
                    uVar41 = (uchar)local_2a8;
                    uVar42 = local_2a8._1_1_;
                    uVar43 = local_2a8._2_1_;
                    uVar44 = local_2a8._3_1_;
                    uVar45 = local_2a8._4_1_;
                    uVar46 = local_2a8._5_1_;
                    uVar47 = local_2a8._6_1_;
                    uVar48 = local_2a8._7_1_;
                    uVar49 = uStack_2a0;
                    uVar50 = uStack_29f;
                    uVar51 = uStack_29e;
                    uVar52 = uStack_29d;
                    uVar53 = uStack_29c;
                    uVar54 = uStack_29b;
                    uVar55 = uStack_29a;
                    uVar56 = uStack_299;
                  }
                  if (bVar35) goto LAB_0030ac7f;
                  uVar18 = uVar18 - 1 & uVar18;
                  unaff_RBX._4_4_ = 0;
                  unaff_RBX._0_4_ = uVar18;
                  SVar22 = local_2c0;
                  uVar28 = local_2c8;
                  pgVar25 = local_2d0;
                  uVar27 = local_2e8;
                  uVar31 = local_2f0;
                } while (uVar18 != 0);
              }
              if ((pgVar25->m[uVar31 + 0xf].n &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[(long)SVar22]) == 0) break;
              uVar30 = uVar27 + 1;
              uVar26 = uVar28 + uVar27 + 1 & (ulong)local_2e0;
              ppVar20 = local_2d8;
            } while (uVar30 <= local_2e0);
            SVar23 = (SourceLocation)0x0;
            SVar15 = SVar22;
LAB_0030ac7f:
            if (SVar23 == (SourceLocation)0x0) {
              if (local_97 == true) {
                SVar59.endLoc = SVar15;
                SVar59.startLoc = local_a8;
                SVar15 = local_a0;
                sVar58 = local_b8;
                goto LAB_0030ae82;
              }
              pDVar16 = Scope::addDiag((Scope *)local_268._0_8_,(DiagCode)0x530006,
                                       (((InstanceSymbolBase *)local_268._8_8_)->super_Symbol).
                                       location);
              Diagnostic::operator<<(pDVar16,(args->super_Symbol).name);
            }
            else {
              lVar29 = *(long *)((long)SVar23 + 0x10);
              *(undefined1 *)((long)SVar23 + 0x18) = 1;
              lookupLocation_04.index = local_268._32_4_;
              lookupLocation_04.scope = (Scope *)local_268._24_8_;
              lookupLocation_04._12_4_ = 0;
              sVar58 = AttributeSymbol::fromSyntax
                                 (*(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                    *)(lVar29 + 0x40),(Scope *)local_268._0_8_,lookupLocation_04);
              unaff_RBX = SVar23;
              if (*(long *)(lVar29 + 0x78) == 0) {
                SVar59 = parsing::Token::range((Token *)(lVar29 + 0x60));
                SVar15 = SVar59.endLoc;
LAB_0030ae82:
                range_01.endLoc = SVar15;
                range_01.startLoc = SVar59.startLoc;
                pPVar14 = anon_unknown_0::PortConnectionBuilder::getImplicitInterface
                                    ((PortConnectionBuilder *)local_268,(InterfacePortSymbol *)args,
                                     range_01,sVar58,SVar23 == (SourceLocation)0x0);
                goto LAB_0030a459;
              }
              pPVar21 = *(PropertyExprSyntax **)(lVar29 + 0x80);
              if (pPVar21 != (PropertyExprSyntax *)0x0) goto LAB_0030a73a;
              pDVar16 = Scope::addDiag((Scope *)local_268._0_8_,(DiagCode)0x530006,
                                       (((InstanceSymbolBase *)local_268._8_8_)->super_Symbol).
                                       location);
              Diagnostic::operator<<(pDVar16,(args->super_Symbol).name);
            }
LAB_0030a786:
            Diagnostic::addNote(pDVar16,(DiagCode)0x50001,(args->super_Symbol).location);
            goto LAB_0030a449;
          }
          sVar58 = (span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>)
                   ZEXT816(0);
          pPVar21 = (PropertyExprSyntax *)0x0;
          SVar23 = unaff_RBX;
          if (local_50 < (ulong)local_268._56_8_) {
            SVar23 = *(SourceLocation *)(local_268._48_8_ + local_50 * 8);
            lookupLocation_02.index = local_268._32_4_;
            lookupLocation_02.scope = (Scope *)local_268._24_8_;
            lookupLocation_02._12_4_ = 0;
            sVar58 = AttributeSymbol::fromSyntax
                               (*(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                  *)((long)SVar23 + 0x40),(Scope *)local_268._0_8_,lookupLocation_02
                               );
            if (*(int *)SVar23 == 0x155) {
              pPVar21 = *(PropertyExprSyntax **)((long)SVar23 + 0x50);
            }
            else {
              pPVar21 = (PropertyExprSyntax *)0x0;
            }
          }
          local_50 = local_50 + 1;
          if (pPVar21 == (PropertyExprSyntax *)0x0) {
            pDVar16 = Scope::addDiag((Scope *)local_268._0_8_,(DiagCode)0x530006,
                                     (((InstanceSymbolBase *)local_268._8_8_)->super_Symbol).
                                     location);
            Diagnostic::operator<<(pDVar16,(args->super_Symbol).name);
            unaff_RBX = SVar23;
            goto LAB_0030a786;
          }
LAB_0030a73a:
          pPVar14 = anon_unknown_0::PortConnectionBuilder::getInterfaceExpr
                              ((PortConnectionBuilder *)local_268,(InterfacePortSymbol *)args,
                               pPVar21,sVar58);
          unaff_RBX = SVar23;
        }
LAB_0030a459:
        local_2b8._0_8_ = pPVar14;
        SmallVectorBase<slang::ast::PortConnection_const*>::
        emplace_back<slang::ast::PortConnection_const*const&>
                  ((SmallVectorBase<slang::ast::PortConnection_const*> *)local_288,
                   (PortConnection **)&local_2b8);
      }
      instance = (InstanceSymbol *)&(instance->super_InstanceSymbolBase).super_Symbol.name;
    } while (instance != (InstanceSymbol *)local_270);
  }
  if (local_98 == true) {
    if (local_50 < (ulong)local_268._56_8_) {
      local_2b8 = slang::syntax::SyntaxNode::getFirstToken
                            (&(*(pointer)(local_268._48_8_ + local_50 * 8))->super_SyntaxNode);
      SVar15 = parsing::Token::location(&local_2b8);
      pDVar16 = Scope::addDiag((Scope *)local_268._0_8_,(DiagCode)0xc80006,SVar15);
      Diagnostic::operator<<
                (pDVar16,((*(InstanceBodySymbol **)(local_268._8_8_ + 0x50))->definition->
                         super_Symbol).name);
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar16->args,(unsigned_long *)&local_2b8);
      local_2b8.kind = (undefined2)local_50;
      local_2b8._2_1_ = local_50._2_1_;
      local_2b8.numFlags.raw = local_50._3_1_;
      local_2b8.rawLen = local_50._4_4_;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar16->args,(unsigned_long *)&local_2b8);
    }
  }
  else {
    iVar60 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
             ::begin(&local_f0);
    if (iVar60.p_ != (table_element_pointer)0x0) {
LAB_0030afb8:
      this_00 = local_268._0_8_;
      ppVar32 = iVar60.p_;
      if ((ppVar32->second).second == false) {
        SVar15 = parsing::Token::location(&((ppVar32->second).first)->name);
        pDVar16 = Scope::addDiag((Scope *)this_00,(DiagCode)0xa00006,SVar15);
        arg = parsing::Token::valueText(&((ppVar32->second).first)->name);
        Diagnostic::operator<<(pDVar16,arg);
        Diagnostic::operator<<
                  (pDVar16,((*(InstanceBodySymbol **)(local_268._8_8_ + 0x50))->definition->
                           super_Symbol).name);
      }
      puVar17 = iVar60.pc_ + 2;
      do {
        puVar24 = puVar17;
        puVar17 = iVar60.pc_;
        ppVar32 = iVar60.p_ + 1;
        if (((uint)iVar60.pc_ & 0xf) == 0xe) goto LAB_0030b05e;
        puVar1 = puVar24 + -1;
        iVar60.p_ = ppVar32;
        iVar60.pc_ = puVar17 + 1;
        puVar17 = puVar24 + 1;
      } while (*puVar1 == '\0');
      puVar24 = puVar24 + -1;
      if (*puVar1 == '\x01') {
        ppVar32 = (table_element_pointer)0x0;
      }
      goto LAB_0030b04e;
    }
  }
LAB_0030b0ac:
  if (local_88.data_ != (pointer)local_88.firstElement) {
    operator_delete(local_88.data_);
  }
  boost::unordered::detail::foa::
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::delete_(local_f0.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
            .
            super_empty_value<slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>,_2U,_false>
            .value_.storage,
            &local_f0.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
             .arrays);
  if ((undefined1 *)local_268._48_8_ != local_268 + 0x48) {
    operator_delete((void *)local_268._48_8_);
  }
  return;
LAB_0030b05e:
  do {
    auVar40[0] = -(*puVar24 == '\0');
    auVar40[1] = -(puVar24[1] == '\0');
    auVar40[2] = -(puVar24[2] == '\0');
    auVar40[3] = -(puVar24[3] == '\0');
    auVar40[4] = -(puVar24[4] == '\0');
    auVar40[5] = -(puVar24[5] == '\0');
    auVar40[6] = -(puVar24[6] == '\0');
    auVar40[7] = -(puVar24[7] == '\0');
    auVar40[8] = -(puVar24[8] == '\0');
    auVar40[9] = -(puVar24[9] == '\0');
    auVar40[10] = -(puVar24[10] == '\0');
    auVar40[0xb] = -(puVar24[0xb] == '\0');
    auVar40[0xc] = -(puVar24[0xc] == '\0');
    auVar40[0xd] = -(puVar24[0xd] == '\0');
    auVar40[0xe] = -(puVar24[0xe] == '\0');
    auVar40[0xf] = -(puVar24[0xf] == '\0');
    uVar18 = (uint)(ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe);
    if (uVar18 == 0x7fff) {
      puVar24 = puVar24 + 0x10;
      ppVar32 = ppVar32 + 0xf;
    }
    else {
      uVar7 = 0;
      if ((uVar18 ^ 0x7fff) != 0) {
        for (; ((uVar18 ^ 0x7fff) >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
      if (puVar24[uVar7] == '\x01') {
        ppVar32 = (table_element_pointer)0x0;
      }
      else {
        puVar24 = puVar24 + uVar7;
        ppVar32 = (table_element_pointer)((long)&(ppVar32->first)._M_len + (ulong)(uVar7 << 5));
      }
    }
  } while (uVar18 == 0x7fff);
LAB_0030b04e:
  iVar60.p_ = ppVar32;
  iVar60.pc_ = puVar24;
  if (ppVar32 == (table_element_pointer)0x0) goto LAB_0030b0ac;
  goto LAB_0030afb8;
}

Assistant:

void PortConnection::makeConnections(
    const InstanceSymbol& instance, std::span<const Symbol* const> ports,
    const SeparatedSyntaxList<PortConnectionSyntax>& portConnections,
    SmallVector<const PortConnection*>& results) {

    PortConnectionBuilder builder(instance, portConnections);
    for (auto portBase : ports) {
        if (portBase->kind == SymbolKind::Port) {
            auto& port = portBase->as<PortSymbol>();
            auto conn = builder.getConnection(port);
            SLANG_ASSERT(conn);
            results.push_back(conn);
        }
        else if (portBase->kind == SymbolKind::MultiPort) {
            auto& port = portBase->as<MultiPortSymbol>();
            auto conn = builder.getConnection(port);
            SLANG_ASSERT(conn);
            results.push_back(conn);
        }
        else {
            auto& port = portBase->as<InterfacePortSymbol>();
            auto conn = builder.getIfaceConnection(port);
            SLANG_ASSERT(conn);
            results.push_back(conn);
        }
    }

    builder.finalize();
}